

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

ON_Interval __thiscall
ON_NurbsSurface::ControlPointSupport(ON_NurbsSurface *this,int dir,int control_point_index)

{
  ON_Interval OVar1;
  
  if ((uint)dir < 2) {
    OVar1 = ON_BsplineControlPointSupport
                      (this->m_order[(uint)dir],this->m_cv_count[(uint)dir],this->m_knot[(uint)dir],
                       control_point_index);
    return (ON_Interval)OVar1.m_t;
  }
  OVar1.m_t[1] = ON_Interval::Nan.m_t[1];
  OVar1.m_t[0] = ON_Interval::Nan.m_t[0];
  return (ON_Interval)OVar1.m_t;
}

Assistant:

const ON_Interval ON_NurbsSurface::ControlPointSupport(int dir, int control_point_index) const
{
  if (0 == dir || 1 == dir)
    return ON_BsplineControlPointSupport(
      this->m_order[dir],
      this->m_cv_count[dir],
      this->m_knot[dir],
      control_point_index
    );
  return ON_Interval::Nan;
}